

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

ErrorComparison ts_parser__compare_versions(TSParser *self,ErrorStatus a,ErrorStatus b)

{
  ErrorComparison EVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (uint)self;
  uVar2 = a.dynamic_precedence;
  if ((a._0_8_ >> 0x20 & 1) == 0) {
    if (((undefined1  [16])b & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      return (ErrorComparison)(uVar2 <= uVar3);
    }
  }
  else if (((undefined1  [16])b & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    return (uVar2 < uVar3) + ErrorComparisonPreferRight;
  }
  if (uVar3 < uVar2) {
    return (ErrorComparison)(((int)((ulong)self >> 0x20) + 1) * (uVar2 - uVar3) < 0x641);
  }
  if (uVar3 >= uVar2 && uVar3 - uVar2 != 0) {
    return ErrorComparisonTakeRight - ((a._12_4_ + 1) * (uVar3 - uVar2) < 0x641);
  }
  EVar1 = ErrorComparisonPreferLeft;
  if ((int)a.cost <= (int)b.cost) {
    EVar1 = (int)a.cost < (int)b.cost | ErrorComparisonNone;
  }
  return EVar1;
}

Assistant:

static ErrorComparison ts_parser__compare_versions(TSParser *self, ErrorStatus a, ErrorStatus b) {
  if (!a.is_in_error && b.is_in_error) {
    if (a.cost < b.cost) {
      return ErrorComparisonTakeLeft;
    } else {
      return ErrorComparisonPreferLeft;
    }
  }

  if (a.is_in_error && !b.is_in_error) {
    if (b.cost < a.cost) {
      return ErrorComparisonTakeRight;
    } else {
      return ErrorComparisonPreferRight;
    }
  }

  if (a.cost < b.cost) {
    if ((b.cost - a.cost) * (1 + a.node_count) > MAX_COST_DIFFERENCE) {
      return ErrorComparisonTakeLeft;
    } else {
      return ErrorComparisonPreferLeft;
    }
  }

  if (b.cost < a.cost) {
    if ((a.cost - b.cost) * (1 + b.node_count) > MAX_COST_DIFFERENCE) {
      return ErrorComparisonTakeRight;
    } else {
      return ErrorComparisonPreferRight;
    }
  }

  if (a.dynamic_precedence > b.dynamic_precedence) return ErrorComparisonPreferLeft;
  if (b.dynamic_precedence > a.dynamic_precedence) return ErrorComparisonPreferRight;
  return ErrorComparisonNone;
}